

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O1

ssize_t __thiscall JSON::JSON_blob::write(JSON_blob *this,int __fd,void *__buf,size_t __n)

{
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  Pipeline *this_00;
  Pl_Base64 base64;
  Pl_Concatenate cat;
  Pl_Base64 *local_a8;
  Pl_Base64 local_a0;
  Pl_Concatenate local_58;
  
  this_00 = (Pipeline *)CONCAT44(in_register_00000034,__fd);
  Pipeline::operator<<(this_00,"\"");
  Pl_Concatenate::Pl_Concatenate(&local_58,"blob concatenate",this_00);
  Pl_Base64::Pl_Base64(&local_a0,"blob base64",&local_58.super_Pipeline,a_encode);
  local_a8 = &local_a0;
  if ((this->fn).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->fn)._M_invoker)((_Any_data *)&this->fn,(Pipeline **)&local_a8);
    Pl_Base64::finish(&local_a0);
    Pipeline::operator<<(this_00,"\"");
    local_a0.super_Pipeline._vptr_Pipeline = (_func_int **)&PTR__Pipeline_002ef018;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.super_Pipeline.identifier._M_dataplus._M_p !=
        &local_a0.super_Pipeline.identifier.field_2) {
      operator_delete(local_a0.super_Pipeline.identifier._M_dataplus._M_p,
                      local_a0.super_Pipeline.identifier.field_2._M_allocated_capacity + 1);
    }
    Pl_Concatenate::~Pl_Concatenate(&local_58);
    return extraout_RAX;
  }
  std::__throw_bad_function_call();
}

Assistant:

void
JSON::JSON_blob::write(Pipeline* p, size_t) const
{
    *p << "\"";
    Pl_Concatenate cat("blob concatenate", p);
    Pl_Base64 base64("blob base64", &cat, Pl_Base64::a_encode);
    fn(&base64);
    base64.finish();
    *p << "\"";
}